

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

int count_wiener_bits(int wiener_win,WienerInfo *wiener_info,WienerInfo *ref_wiener_info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = 0;
  if (wiener_win == 7) {
    iVar1 = aom_count_primitive_refsubexpfin
                      (0x10,1,(short)*(undefined4 *)ref_wiener_info->vfilter + 5,
                       (short)*(undefined4 *)wiener_info->vfilter + 5);
  }
  iVar2 = aom_count_primitive_refsubexpfin
                    (0x20,2,ref_wiener_info->vfilter[1] + 0x17,wiener_info->vfilter[1] + 0x17);
  iVar3 = aom_count_primitive_refsubexpfin
                    (0x40,3,(short)*(undefined4 *)(ref_wiener_info->vfilter + 2) + 0x11,
                     (short)*(undefined4 *)(wiener_info->vfilter + 2) + 0x11);
  iVar3 = iVar3 + iVar2 + iVar1;
  if (wiener_win == 7) {
    iVar1 = aom_count_primitive_refsubexpfin
                      (0x10,1,(short)*(undefined4 *)ref_wiener_info->hfilter + 5,
                       (short)*(undefined4 *)wiener_info->hfilter + 5);
    iVar3 = iVar3 + iVar1;
  }
  iVar1 = aom_count_primitive_refsubexpfin
                    (0x20,2,ref_wiener_info->hfilter[1] + 0x17,wiener_info->hfilter[1] + 0x17);
  iVar2 = aom_count_primitive_refsubexpfin
                    (0x40,3,(short)*(undefined4 *)(ref_wiener_info->hfilter + 2) + 0x11,
                     (short)*(undefined4 *)(wiener_info->hfilter + 2) + 0x11);
  return iVar2 + iVar1 + iVar3;
}

Assistant:

static int count_wiener_bits(int wiener_win, WienerInfo *wiener_info,
                             WienerInfo *ref_wiener_info) {
  int bits = 0;
  if (wiener_win == WIENER_WIN)
    bits += aom_count_primitive_refsubexpfin(
        WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
        WIENER_FILT_TAP0_SUBEXP_K,
        ref_wiener_info->vfilter[0] - WIENER_FILT_TAP0_MINV,
        wiener_info->vfilter[0] - WIENER_FILT_TAP0_MINV);
  bits += aom_count_primitive_refsubexpfin(
      WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
      WIENER_FILT_TAP1_SUBEXP_K,
      ref_wiener_info->vfilter[1] - WIENER_FILT_TAP1_MINV,
      wiener_info->vfilter[1] - WIENER_FILT_TAP1_MINV);
  bits += aom_count_primitive_refsubexpfin(
      WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
      WIENER_FILT_TAP2_SUBEXP_K,
      ref_wiener_info->vfilter[2] - WIENER_FILT_TAP2_MINV,
      wiener_info->vfilter[2] - WIENER_FILT_TAP2_MINV);
  if (wiener_win == WIENER_WIN)
    bits += aom_count_primitive_refsubexpfin(
        WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
        WIENER_FILT_TAP0_SUBEXP_K,
        ref_wiener_info->hfilter[0] - WIENER_FILT_TAP0_MINV,
        wiener_info->hfilter[0] - WIENER_FILT_TAP0_MINV);
  bits += aom_count_primitive_refsubexpfin(
      WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
      WIENER_FILT_TAP1_SUBEXP_K,
      ref_wiener_info->hfilter[1] - WIENER_FILT_TAP1_MINV,
      wiener_info->hfilter[1] - WIENER_FILT_TAP1_MINV);
  bits += aom_count_primitive_refsubexpfin(
      WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
      WIENER_FILT_TAP2_SUBEXP_K,
      ref_wiener_info->hfilter[2] - WIENER_FILT_TAP2_MINV,
      wiener_info->hfilter[2] - WIENER_FILT_TAP2_MINV);
  return bits;
}